

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.h
# Opt level: O2

void __thiscall
Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::AddPendingDisposeObject
          (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  code *pcVar1;
  bool bVar2;
  ushort uVar3;
  undefined4 *puVar4;
  
  uVar3 = (short)*(undefined4 *)&this->pendingDisposeCount + 1;
  this->pendingDisposeCount = uVar3;
  if ((this->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.objectCount < uVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.h"
                       ,0x45,"(this->pendingDisposeCount <= this->objectCount)",
                       "this->pendingDisposeCount <= this->objectCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void AddPendingDisposeObject()
    {
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
        {
            AssertMsg(!this->isPendingConcurrentSweepPrep, "Finalizable blocks don't support allocations during concurrent sweep.");
        }
#endif

        this->pendingDisposeCount++;
        Assert(this->pendingDisposeCount <= this->objectCount);
    }